

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_float.h
# Opt level: O1

void duckdb_fast_float::detail::decimal_right_shift(decimal *h,uint32_t shift)

{
  byte bVar1;
  ulong uVar2;
  uint8_t uVar3;
  uint8_t *puVar4;
  int iVar5;
  ulong uVar6;
  uint32_t uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  
  bVar1 = (byte)shift;
  puVar4 = h->digits;
  uVar7 = 0;
  uVar2 = 0;
  while (h->num_digits != uVar7) {
    uVar6 = (ulong)uVar7;
    uVar7 = uVar7 + 1;
    uVar2 = (ulong)puVar4[uVar6] + uVar2 * 10;
    if (uVar2 >> (bVar1 & 0x3f) != 0) goto LAB_012819b9;
  }
  if (uVar2 == 0) {
    return;
  }
  uVar6 = uVar2 >> (bVar1 & 0x3f);
  uVar7 = h->num_digits;
  while (uVar6 == 0) {
    uVar2 = uVar2 * 10;
    uVar7 = uVar7 + 1;
    uVar6 = uVar2 >> (bVar1 & 0x3f);
  }
LAB_012819b9:
  iVar5 = (h->decimal_point - uVar7) + 1;
  h->decimal_point = iVar5;
  if (iVar5 < -0x7ff) {
    h->negative = false;
    h->truncated = false;
    h->num_digits = 0;
    h->decimal_point = 0;
    return;
  }
  uVar6 = ~(-1L << (bVar1 & 0x3f));
  uVar10 = h->num_digits - uVar7;
  uVar9 = 0;
  if (uVar7 <= h->num_digits && uVar10 != 0) {
    uVar8 = uVar10;
    do {
      uVar11 = uVar2 >> (bVar1 & 0x3f);
      uVar2 = (ulong)puVar4[uVar7] + (uVar2 & uVar6) * 10;
      *puVar4 = (uint8_t)uVar11;
      puVar4 = puVar4 + 1;
      uVar8 = uVar8 - 1;
      uVar9 = uVar10;
    } while (uVar8 != 0);
  }
  for (; uVar2 != 0; uVar2 = (uVar2 & uVar6) * 10) {
    uVar3 = (uint8_t)(uVar2 >> (bVar1 & 0x3f));
    if (uVar9 < 0x300) {
      uVar11 = (ulong)uVar9;
      uVar9 = uVar9 + 1;
      h->digits[uVar11] = uVar3;
    }
    else if (uVar3 != '\0') {
      h->truncated = true;
    }
  }
  h->num_digits = uVar9;
  if (uVar9 != 0) {
    uVar9 = uVar9 - 1;
    do {
      if (h->digits[uVar9] != '\0') {
        return;
      }
      h->num_digits = uVar9;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0xffffffff);
  }
  return;
}

Assistant:

inline void decimal_right_shift(decimal &h, uint32_t shift) {
  uint32_t read_index = 0;
  uint32_t write_index = 0;

  uint64_t n = 0;

  while ((n >> shift) == 0) {
    if (read_index < h.num_digits) {
      n = (10 * n) + h.digits[read_index++];
    } else if (n == 0) {
      return;
    } else {
      while ((n >> shift) == 0) {
        n = 10 * n;
        read_index++;
      }
      break;
    }
  }
  h.decimal_point -= int32_t(read_index - 1);
  if (h.decimal_point < -decimal_point_range) { // it is zero
    h.num_digits = 0;
    h.decimal_point = 0;
    h.negative = false;
    h.truncated = false;
    return;
  }
  uint64_t mask = (uint64_t(1) << shift) - 1;
  while (read_index < h.num_digits) {
    uint8_t new_digit = uint8_t(n >> shift);
    n = (10 * (n & mask)) + h.digits[read_index++];
    h.digits[write_index++] = new_digit;
  }
  while (n > 0) {
    uint8_t new_digit = uint8_t(n >> shift);
    n = 10 * (n & mask);
    if (write_index < max_digits) {
      h.digits[write_index++] = new_digit;
    } else if (new_digit > 0) {
      h.truncated = true;
    }
  }
  h.num_digits = write_index;
  trim(h);
}